

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtypes.h
# Opt level: O0

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> * __thiscall
wasm::SubTypes::getSubTypes
          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__return_storage_ptr__,
          SubTypes *this,HeapType type)

{
  SubTypes *this_local;
  HeapType type_local;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *ret;
  
  this_local = (SubTypes *)type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  getStrictSubTypes(__return_storage_ptr__,this,type);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
            (__return_storage_ptr__,(value_type *)&this_local);
  return __return_storage_ptr__;
}

Assistant:

std::vector<HeapType> getSubTypes(HeapType type) {
    auto ret = getStrictSubTypes(type);
    ret.push_back(type);
    return ret;
  }